

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_SetLineTrigger(FParser *this)

{
  uint uVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  maplinedef_t mld;
  FLineIdIterator itr;
  maplinedef_t local_46;
  FLineIdIterator local_38;
  int iVar5;
  
  if (1 < this->t_argc) {
    uVar3 = intvalue(this->t_argv);
    iVar4 = intvalue(this->t_argv + 1);
    if (this->t_argc < 3) {
      sVar2 = 0;
    }
    else {
      iVar5 = intvalue(this->t_argv + 2);
      sVar2 = (short)iVar5;
    }
    local_38.start = tagManager.IDHashFirst[uVar3 & 0xff];
    local_38.searchtag = uVar3;
    uVar3 = FLineIdIterator::Next(&local_38);
    if (-1 < (int)uVar3) {
      do {
        local_46.special = (short)iVar4;
        local_46.flags = 0;
        uVar1 = lines[uVar3].flags;
        local_46.tag = sVar2;
        P_TranslateLineDef((line_t *)(lines + uVar3),&local_46,-1);
        lines[uVar3].flags = lines[uVar3].flags & 0x803e00 | uVar1 & 0xff7fc1ff;
        uVar3 = FLineIdIterator::Next(&local_38);
      } while (-1 < (int)uVar3);
    }
    return;
  }
  script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
  return;
}

Assistant:

void FParser::SF_SetLineTrigger()
{
	int i,id,spec,tag(0);

	if (CheckArgs(2))
	{
		id=intvalue(t_argv[0]);
		spec=intvalue(t_argv[1]);
		if (t_argc>2) tag=intvalue(t_argv[2]);
		FLineIdIterator itr(id);
		while ((i = itr.Next()) >= 0)
		{
			maplinedef_t mld;
			mld.special = spec;
			mld.tag = tag;
			mld.flags = 0;
			int f = lines[i].flags;
			P_TranslateLineDef(&lines[i], &mld);
			lines[i].flags = (lines[i].flags & (ML_MONSTERSCANACTIVATE | ML_REPEAT_SPECIAL | ML_SPAC_MASK | ML_FIRSTSIDEONLY)) |
				(f & ~(ML_MONSTERSCANACTIVATE | ML_REPEAT_SPECIAL | ML_SPAC_MASK | ML_FIRSTSIDEONLY));

		}
	}
}